

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

QString * __thiscall
LdConfigDirWrapper::translateGuardFlagsContent
          (QString *__return_storage_ptr__,LdConfigDirWrapper *this,QString *delim)

{
  bool bVar1;
  uint64_t uVar2;
  reference puVar3;
  qsizetype qVar4;
  undefined1 local_a8 [8];
  QString flagInfo;
  iterator iStack_88;
  DWORD nextFlag;
  _Base_ptr local_80;
  undefined1 local_78 [8];
  QStringList list;
  iterator itr;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> flagsSet;
  DWORD GuardFlags;
  bool isOk;
  QString *delim_local;
  LdConfigDirWrapper *this_local;
  
  flagsSet._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  uVar2 = ExeElementWrapper::getNumValue
                    ((ExeElementWrapper *)this,0x18,
                     (bool *)((long)&flagsSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
  ;
  flagsSet._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (DWORD)uVar2;
  if ((flagsSet._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    QString::QString(__return_storage_ptr__,"-");
  }
  else {
    getGuardFlagsSet((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &itr,(DWORD)flagsSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::_Rb_tree_const_iterator<unsigned_int>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<unsigned_int> *)&list.d.size);
    QList<QString>::QList((QList<QString> *)local_78);
    local_80 = (_Base_ptr)
               std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                         ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&itr);
    list.d.size = (qsizetype)local_80;
    while( true ) {
      iStack_88 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &itr);
      bVar1 = std::operator!=((_Self *)&list.d.size,&stack0xffffffffffffff78);
      if (!bVar1) break;
      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)&list.d.size);
      flagInfo.d.size._4_4_ = *puVar3;
      translateGuardFlag((QString *)local_a8,flagInfo.d.size._4_4_);
      qVar4 = QString::length((QString *)local_a8);
      if (qVar4 != 0) {
        QList<QString>::append((QList<QString> *)local_78,(parameter_type)local_a8);
      }
      QString::~QString((QString *)local_a8);
      std::_Rb_tree_const_iterator<unsigned_int>::operator++
                ((_Rb_tree_const_iterator<unsigned_int> *)&list.d.size);
    }
    QListSpecialMethods<QString>::join
              (__return_storage_ptr__,(QListSpecialMethods<QString> *)local_78,delim);
    QList<QString>::~QList((QList<QString> *)local_78);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&itr);
  }
  return __return_storage_ptr__;
}

Assistant:

QString LdConfigDirWrapper::translateGuardFlagsContent(const QString& delim)
{
    bool isOk = false;
    DWORD GuardFlags = this->getNumValue(GUARD_FLAGS, &isOk);
    if (!isOk) {
        return "-";
    }
    std::set<DWORD> flagsSet = LdConfigDirWrapper::getGuardFlagsSet(GuardFlags);
    std::set<DWORD>::iterator itr;
    QStringList list;
    for (itr = flagsSet.begin() ; itr != flagsSet.end(); ++itr) {
        const DWORD nextFlag = *itr;
        const QString flagInfo = LdConfigDirWrapper::translateGuardFlag(nextFlag);
        if (flagInfo.length() == 0) continue;
        list.append(flagInfo);
    }
    return list.join(delim);
}